

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_> *
Catch::sortTests(vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                 *__return_storage_ptr__,IConfig *config,
                vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                *unsortedTestCases)

{
  pointer pTVar1;
  pointer ppVar2;
  int iVar3;
  result_type rVar4;
  result_type rVar5;
  vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
  *__range3;
  size_type sVar6;
  pointer ppVar7;
  TestCaseHandle *handle;
  pointer __args_1;
  vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
  indexed_tests;
  ReusableStringStream local_50;
  SourceLineInfo local_40;
  
  iVar3 = (*config->_vptr_IConfig[0x10])(config);
  if (iVar3 == 2) {
    seedRng(config);
    rng();
    rVar4 = SimplePcg32::operator()(&rng::s_rng);
    rVar5 = SimplePcg32::operator()(&rng::s_rng);
    indexed_tests.
    super__Vector_base<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    indexed_tests.
    super__Vector_base<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    indexed_tests.
    super__Vector_base<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::
    vector<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
    ::reserve(&indexed_tests,
              (long)(unsortedTestCases->
                    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(unsortedTestCases->
                    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 4);
    pTVar1 = (unsortedTestCases->
             super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    for (__args_1 = (unsortedTestCases->
                    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>
                    )._M_impl.super__Vector_impl_data._M_start; __args_1 != pTVar1;
        __args_1 = __args_1 + 1) {
      local_50.m_index = CONCAT44(rVar4,rVar5);
      for (sVar6 = 0; (__args_1->m_info->name)._M_string_length != sVar6; sVar6 = sVar6 + 1) {
        local_50.m_index =
             (local_50.m_index ^ (long)(__args_1->m_info->name)._M_dataplus._M_p[sVar6]) *
             0x100000001b3;
      }
      std::
      vector<std::pair<unsigned_long,Catch::TestCaseHandle>,std::allocator<std::pair<unsigned_long,Catch::TestCaseHandle>>>
      ::emplace_back<unsigned_long,Catch::TestCaseHandle_const&>
                ((vector<std::pair<unsigned_long,Catch::TestCaseHandle>,std::allocator<std::pair<unsigned_long,Catch::TestCaseHandle>>>
                  *)&indexed_tests,&local_50.m_index,__args_1);
    }
    std::
    __sort<__gnu_cxx::__normal_iterator<std::pair<unsigned_long,Catch::TestCaseHandle>*,std::vector<std::pair<unsigned_long,Catch::TestCaseHandle>,std::allocator<std::pair<unsigned_long,Catch::TestCaseHandle>>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (indexed_tests.
               super__Vector_base<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               indexed_tests.
               super__Vector_base<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    (__return_storage_ptr__->
    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>)._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>)._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::reserve
              (__return_storage_ptr__,
               ((long)indexed_tests.
                      super__Vector_base<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)indexed_tests.
                     super__Vector_base<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x18);
    ppVar2 = indexed_tests.
             super__Vector_base<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (ppVar7 = indexed_tests.
                  super__Vector_base<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; ppVar7 != ppVar2; ppVar7 = ppVar7 + 1)
    {
      std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::push_back
                (__return_storage_ptr__,&ppVar7->second);
    }
    std::
    _Vector_base<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
    ::~_Vector_base(&indexed_tests.
                     super__Vector_base<std::pair<unsigned_long,_Catch::TestCaseHandle>,_std::allocator<std::pair<unsigned_long,_Catch::TestCaseHandle>_>_>
                   );
  }
  else if (iVar3 == 1) {
    std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::vector
              (__return_storage_ptr__,unsortedTestCases);
    std::
    __sort<__gnu_cxx::__normal_iterator<Catch::TestCaseHandle*,std::vector<Catch::TestCaseHandle,std::allocator<Catch::TestCaseHandle>>>,__gnu_cxx::__ops::_Iter_less_iter>
              ((__return_storage_ptr__->
               super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
               _M_impl.super__Vector_impl_data._M_start,
               (__return_storage_ptr__->
               super__Vector_base<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>).
               _M_impl.super__Vector_impl_data._M_finish);
  }
  else {
    if (iVar3 != 0) {
      ReusableStringStream::ReusableStringStream(&local_50);
      local_40.file =
           "/workspace/llm4binary/github/license_all_cmakelists_25/H-EAL[P]vfs/tests/catch_amalgamated.cpp"
      ;
      local_40.line = 0x149c;
      operator<<(local_50.m_oss,&local_40);
      std::operator<<(local_50.m_oss,": Internal Catch2 error: ");
      std::operator<<(local_50.m_oss,"Unknown test order value!");
      std::__cxx11::stringbuf::str();
      throw_logic_error((string *)&indexed_tests);
    }
    std::vector<Catch::TestCaseHandle,_std::allocator<Catch::TestCaseHandle>_>::vector
              (__return_storage_ptr__,unsortedTestCases);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<TestCaseHandle> sortTests(IConfig const &config, std::vector<TestCaseHandle> const &unsortedTestCases) {
        switch (config.runOrder()) {
        case TestRunOrder::Declared:
            return unsortedTestCases;

        case TestRunOrder::LexicographicallySorted: {
            std::vector<TestCaseHandle> sorted = unsortedTestCases;
            std::sort(sorted.begin(), sorted.end());
            return sorted;
        }
        case TestRunOrder::Randomized: {
            seedRng(config);
            HashTest h(rng());
            std::vector<std::pair<uint64_t, TestCaseHandle>> indexed_tests;
            indexed_tests.reserve(unsortedTestCases.size());

            for (auto const &handle : unsortedTestCases) {
                indexed_tests.emplace_back(h(handle.getTestCaseInfo()), handle);
            }

            std::sort(indexed_tests.begin(), indexed_tests.end());

            std::vector<TestCaseHandle> randomized;
            randomized.reserve(indexed_tests.size());

            for (auto const &indexed : indexed_tests) {
                randomized.push_back(indexed.second);
            }

            return randomized;
        }
        }

        CATCH_INTERNAL_ERROR("Unknown test order value!");
    }